

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_CompSt(ast *node)

{
  ast *paVar1;
  ast *paVar2;
  
  paVar1 = node;
  while( true ) {
    paVar1 = child(paVar1,2);
    paVar2 = child(paVar1,1);
    if ((paVar2 == (ast *)0x0) || (paVar2->type == -1)) break;
    paVar2 = child(paVar2,2);
    TR_DecList(paVar2);
  }
  paVar1 = child(node,3);
  TR_StmtList(paVar1);
  return;
}

Assistant:

static void TR_CompSt(ast *node) {
    TR_DefList(child(node, 2));
    TR_StmtList(child(node, 3));
}